

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

int Gia_ObjCheckMffc(Gia_Man_t *p,Gia_Obj_t *pRoot,int Limit,Vec_Int_t *vNodes,Vec_Int_t *vLeaves,
                    Vec_Int_t *vInners)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  undefined4 local_44;
  int i;
  int iObj;
  int RetValue;
  Vec_Int_t *vInners_local;
  Vec_Int_t *vLeaves_local;
  Vec_Int_t *vNodes_local;
  int Limit_local;
  Gia_Obj_t *pRoot_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vNodes);
  iVar1 = Gia_ObjCheckMffc_rec(p,pRoot,Limit,vNodes);
  if (iVar1 != 0) {
    Vec_IntClear(vLeaves);
    Vec_IntClear(vInners);
    Vec_IntSort(vNodes,0);
    for (local_44 = 0; iVar2 = Vec_IntSize(vNodes), local_44 < iVar2; local_44 = local_44 + 1) {
      iVar2 = Vec_IntEntry(vNodes,local_44);
      iVar3 = Gia_ObjRefNumId(p,iVar2);
      if (iVar3 < 1) {
        pObj = Gia_ManObj(p,iVar2);
        iVar3 = Gia_ObjIsCi(pObj);
        if (iVar3 != 0) goto LAB_009c6044;
        iVar3 = Vec_IntSize(vInners);
        if ((iVar3 == 0) || (iVar3 = Vec_IntEntryLast(vInners), iVar3 != iVar2)) {
          Vec_IntPush(vInners,iVar2);
        }
      }
      else {
LAB_009c6044:
        iVar3 = Vec_IntSize(vLeaves);
        if ((iVar3 == 0) || (iVar3 = Vec_IntEntryLast(vLeaves), iVar3 != iVar2)) {
          Vec_IntPush(vLeaves,iVar2);
        }
      }
    }
    iVar2 = Gia_ObjId(p,pRoot);
    Vec_IntPush(vInners,iVar2);
  }
  for (local_44 = 0; iVar2 = Vec_IntSize(vNodes), local_44 < iVar2; local_44 = local_44 + 1) {
    iVar2 = Vec_IntEntry(vNodes,local_44);
    Gia_ObjRefIncId(p,iVar2);
  }
  return iVar1;
}

Assistant:

static inline int Gia_ObjCheckMffc( Gia_Man_t * p, Gia_Obj_t * pRoot, int Limit, Vec_Int_t * vNodes, Vec_Int_t * vLeaves, Vec_Int_t * vInners )
{
    int RetValue, iObj, i;
    Vec_IntClear( vNodes );
    RetValue = Gia_ObjCheckMffc_rec( p, pRoot, Limit, vNodes );
    if ( RetValue )
    {
        Vec_IntClear( vLeaves );
        Vec_IntClear( vInners );
        Vec_IntSort( vNodes, 0 );
        Vec_IntForEachEntry( vNodes, iObj, i )
            if ( Gia_ObjRefNumId(p, iObj) > 0 || Gia_ObjIsCi(Gia_ManObj(p, iObj)) )
            {
                if ( !Vec_IntSize(vLeaves) || Vec_IntEntryLast(vLeaves) != iObj )
                    Vec_IntPush( vLeaves, iObj );
            }
            else
            {
                if ( !Vec_IntSize(vInners) || Vec_IntEntryLast(vInners) != iObj )
                    Vec_IntPush( vInners, iObj );
            }
        Vec_IntPush( vInners, Gia_ObjId(p, pRoot) );
    }
    Vec_IntForEachEntry( vNodes, iObj, i )
        Gia_ObjRefIncId( p, iObj );
    return RetValue;
}